

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeGeneratorFunction
               (DynamicObject *instance,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  code *pcVar1;
  JavascriptGeneratorFunction *pJVar2;
  DeferredTypeHandlerBase *this;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  Type *this_00;
  DynamicTypeHandler **ppDVar6;
  DynamicObject *pDVar7;
  GeneratorVirtualScriptFunction *this_01;
  ScriptContext *requestContext;
  undefined4 *puVar8;
  WriteBarrierPtr *local_70;
  JavascriptString *pJStack_50;
  bool status;
  JavascriptString *functionName;
  GeneratorVirtualScriptFunction *scriptFunction;
  Var varLength;
  JavascriptLibrary *javascriptLibrary;
  JavascriptGeneratorFunction *pJStack_28;
  bool isAnonymousFunction;
  JavascriptGeneratorFunction *function;
  DeferredTypeHandlerBase *pDStack_18;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *instance_local;
  
  function._4_4_ = mode;
  pDStack_18 = typeHandler;
  typeHandler_local = (DeferredTypeHandlerBase *)instance;
  pJStack_28 = VarTo<Js::JavascriptGeneratorFunction,Js::DynamicObject>(instance);
  iVar4 = (*(pJStack_28->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x77])();
  javascriptLibrary._7_1_ = (byte)iVar4 & 1;
  this_00 = RecyclableObject::GetType((RecyclableObject *)pJStack_28);
  varLength = Js::Type::GetLibrary(this_00);
  this = pDStack_18;
  pJVar2 = pJStack_28;
  if ((javascriptLibrary._7_1_ & 1) == 0) {
    local_70 = (WriteBarrierPtr *)
               &((JavascriptLibrary *)varLength)->functionWithPrototypeAndLengthTypeHandler;
  }
  else {
    local_70 = (WriteBarrierPtr *)
               &((JavascriptLibrary *)varLength)->anonymousFunctionWithPrototypeTypeHandler;
  }
  ppDVar6 = Memory::WriteBarrierPtr::operator_cast_to_DynamicTypeHandler__(local_70);
  DeferredTypeHandlerBase::ConvertFunction(this,(JavascriptFunction *)pJVar2,*ppDVar6);
  pJVar2 = pJStack_28;
  pDVar7 = CreateGeneratorConstructorPrototypeObject((JavascriptLibrary *)varLength);
  (*(pJVar2->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(pJVar2,0x124,pDVar7,4,0,0,0xf);
  this_01 = JavascriptGeneratorFunction::GetGeneratorVirtualScriptFunction(pJStack_28);
  functionName = (JavascriptString *)this_01;
  requestContext = RecyclableObject::GetScriptContext((RecyclableObject *)this_01);
  BVar5 = RecyclableObject::GetProperty
                    ((RecyclableObject *)this_01,this_01,0xd1,&scriptFunction,
                     (PropertyValueInfo *)0x0,requestContext);
  if (BVar5 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x347,"(false)",
                                "Initializing Generator function without a length property - why isn\'t there a length?."
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr();
    *puVar8 = 0;
    scriptFunction = (GeneratorVirtualScriptFunction *)TaggedInt::ToVarUnchecked(0);
  }
  (*(pJStack_28->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(pJStack_28,0xd1,scriptFunction,2,0,0,0);
  if ((javascriptLibrary._7_1_ & 1) == 0) {
    pJStack_50 = (JavascriptString *)0x0;
    bVar3 = JavascriptFunction::GetFunctionName
                      ((JavascriptFunction *)pJStack_28,&stack0xffffffffffffffb0);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                  ,0x350,"(status)","status");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    (*(pJStack_28->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
      super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(pJStack_28,0x106,pJStack_50,2,0,0,0xf);
  }
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeGeneratorFunction(DynamicObject *instance, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        JavascriptGeneratorFunction *function = VarTo<JavascriptGeneratorFunction>(instance);
        bool isAnonymousFunction = function->IsAnonymousFunction();

        JavascriptLibrary* javascriptLibrary = function->GetType()->GetLibrary();
        typeHandler->ConvertFunction(function, isAnonymousFunction ? javascriptLibrary->anonymousFunctionWithPrototypeTypeHandler : javascriptLibrary->functionWithPrototypeAndLengthTypeHandler);
        function->SetPropertyWithAttributes(PropertyIds::prototype, javascriptLibrary->CreateGeneratorConstructorPrototypeObject(), PropertyWritable, nullptr);

        Var varLength;
        GeneratorVirtualScriptFunction* scriptFunction = function->GetGeneratorVirtualScriptFunction();
        if (!scriptFunction->GetProperty(scriptFunction, PropertyIds::length, &varLength, nullptr, scriptFunction->GetScriptContext()))
        {
            // TODO - remove this if or convert it to a FailFast if this assert never triggers
            // Nothing in the ChakraCore CI will reach this code
            AssertMsg(false, "Initializing Generator function without a length property - why isn't there a length?.");
            varLength = TaggedInt::ToVarUnchecked(0);
        }
        function->SetPropertyWithAttributes(PropertyIds::length, varLength, PropertyConfigurable, nullptr, PropertyOperation_None, SideEffects_None);

        if (!isAnonymousFunction)
        {
            JavascriptString * functionName = nullptr;
            DebugOnly(bool status = ) ((Js::JavascriptFunction*)function)->GetFunctionName(&functionName);
            Assert(status);
            function->SetPropertyWithAttributes(PropertyIds::name,functionName, PropertyConfigurable, nullptr);
        }

        return true;
    }